

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<Replace>::Inserter::insertOne(Inserter *this,qsizetype pos,Replace *t)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  Replace *pRVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  qsizetype qVar6;
  Replace *pRVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  long lVar11;
  long lVar12;
  
  pRVar3 = this->begin;
  lVar11 = this->size;
  pRVar7 = pRVar3 + lVar11;
  this->end = pRVar7;
  this->last = pRVar3 + lVar11 + -1;
  this->where = pRVar3 + pos;
  lVar11 = lVar11 - pos;
  this->sourceCopyConstruct = 0;
  this->nSource = 1;
  this->move = 1 - lVar11;
  this->sourceCopyAssign = 1;
  if (lVar11 < 1) {
    this->sourceCopyConstruct = 1 - lVar11;
    this->move = 0;
    this->sourceCopyAssign = lVar11;
  }
  if (this->sourceCopyConstruct != 0) {
    pDVar4 = (t->in).d.d;
    (t->in).d.d = (Data *)0x0;
    (pRVar7->in).d.d = pDVar4;
    pcVar5 = (t->in).d.ptr;
    (t->in).d.ptr = (char16_t *)0x0;
    (pRVar7->in).d.ptr = pcVar5;
    qVar6 = (t->in).d.size;
    (t->in).d.size = 0;
    (pRVar7->in).d.size = qVar6;
    pDVar4 = (t->out).d.d;
    (t->out).d.d = (Data *)0x0;
    (pRVar7->out).d.d = pDVar4;
    pcVar5 = (t->out).d.ptr;
    (t->out).d.ptr = (char16_t *)0x0;
    (pRVar7->out).d.ptr = pcVar5;
    qVar6 = (t->out).d.size;
    (t->out).d.size = 0;
    (pRVar7->out).d.size = qVar6;
    this->size = this->size + 1;
    return;
  }
  pDVar4 = pRVar7[-1].in.d.d;
  pcVar5 = pRVar7[-1].in.d.ptr;
  pRVar7[-1].in.d.d = (Data *)0x0;
  pRVar7[-1].in.d.ptr = (char16_t *)0x0;
  (pRVar7->in).d.d = pDVar4;
  (pRVar7->in).d.ptr = pcVar5;
  qVar6 = pRVar7[-1].in.d.size;
  pRVar7[-1].in.d.size = 0;
  (pRVar7->in).d.size = qVar6;
  pDVar4 = pRVar7[-1].out.d.d;
  pcVar5 = pRVar7[-1].out.d.ptr;
  pRVar7[-1].out.d.d = (Data *)0x0;
  pRVar7[-1].out.d.ptr = (char16_t *)0x0;
  (pRVar7->out).d.d = pDVar4;
  (pRVar7->out).d.ptr = pcVar5;
  qVar6 = pRVar7[-1].out.d.size;
  pRVar7[-1].out.d.size = 0;
  (pRVar7->out).d.size = qVar6;
  this->size = this->size + 1;
  if (this->move != 0) {
    lVar11 = 0;
    lVar12 = 0;
    do {
      pRVar7 = this->last;
      puVar2 = (undefined8 *)((long)&(pRVar7->in).d.d + lVar11);
      uVar8 = *puVar2;
      uVar9 = puVar2[1];
      puVar1 = (undefined8 *)((long)&pRVar7[-1].in.d.d + lVar11);
      uVar10 = puVar1[1];
      puVar2 = (undefined8 *)((long)&(pRVar7->in).d.d + lVar11);
      *puVar2 = *puVar1;
      puVar2[1] = uVar10;
      puVar2 = (undefined8 *)((long)&pRVar7[-1].in.d.d + lVar11);
      *puVar2 = uVar8;
      puVar2[1] = uVar9;
      uVar8 = *(undefined8 *)((long)&(pRVar7->in).d.size + lVar11);
      *(undefined8 *)((long)&(pRVar7->in).d.size + lVar11) =
           *(undefined8 *)((long)pRVar7 + lVar11 + -0x20);
      *(undefined8 *)((long)pRVar7 + lVar11 + -0x20) = uVar8;
      puVar2 = (undefined8 *)((long)&(pRVar7->out).d.d + lVar11);
      uVar8 = *puVar2;
      uVar9 = puVar2[1];
      puVar2 = (undefined8 *)((long)pRVar7 + lVar11 + -0x18);
      uVar10 = puVar2[1];
      puVar1 = (undefined8 *)((long)&(pRVar7->out).d.d + lVar11);
      *puVar1 = *puVar2;
      puVar1[1] = uVar10;
      puVar2 = (undefined8 *)((long)pRVar7 + lVar11 + -0x18);
      *puVar2 = uVar8;
      puVar2[1] = uVar9;
      uVar8 = *(undefined8 *)((long)&(pRVar7->out).d.size + lVar11);
      *(undefined8 *)((long)&(pRVar7->out).d.size + lVar11) =
           *(undefined8 *)((long)pRVar7 + lVar11 + -8);
      *(undefined8 *)((long)pRVar7 + lVar11 + -8) = uVar8;
      lVar12 = lVar12 + -1;
      lVar11 = lVar11 + -0x30;
    } while (lVar12 != this->move);
  }
  pRVar7 = this->where;
  pDVar4 = (pRVar7->in).d.d;
  (pRVar7->in).d.d = (t->in).d.d;
  (t->in).d.d = pDVar4;
  pcVar5 = (pRVar7->in).d.ptr;
  (pRVar7->in).d.ptr = (t->in).d.ptr;
  (t->in).d.ptr = pcVar5;
  qVar6 = (pRVar7->in).d.size;
  (pRVar7->in).d.size = (t->in).d.size;
  (t->in).d.size = qVar6;
  pDVar4 = (pRVar7->out).d.d;
  (pRVar7->out).d.d = (t->out).d.d;
  (t->out).d.d = pDVar4;
  pcVar5 = (pRVar7->out).d.ptr;
  (pRVar7->out).d.ptr = (t->out).d.ptr;
  (t->out).d.ptr = pcVar5;
  qVar6 = (pRVar7->out).d.size;
  (pRVar7->out).d.size = (t->out).d.size;
  (t->out).d.size = qVar6;
  return;
}

Assistant:

void setup(qsizetype pos, qsizetype n)
        {
            end = begin + size;
            last = end - 1;
            where = begin + pos;
            qsizetype dist = size - pos;
            sourceCopyConstruct = 0;
            nSource = n;
            move = n - dist; // smaller 0
            sourceCopyAssign = n;
            if (n > dist) {
                sourceCopyConstruct = n - dist;
                move = 0;
                sourceCopyAssign -= sourceCopyConstruct;
            }
        }